

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1557.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  uint in_EAX;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int running_handles;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                  ,0x24,iVar2,uVar4);
  }
  if (iVar2 != 0) {
    return iVar2;
  }
  lVar5 = curl_multi_init();
  iVar2 = 0;
  if (lVar5 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                  ,0x26);
    iVar2 = 0x7b;
  }
  if (lVar5 != 0) {
    iVar3 = curl_multi_setopt(lVar5,7,1);
    uVar1 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar4 = curl_multi_strerror(iVar3);
      curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                    ,0x27,iVar3,uVar4);
      iVar2 = iVar3;
    }
    iVar3 = 0;
    if (iVar2 == 0) {
      lVar6 = curl_easy_init();
      if (lVar6 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                      ,0x29);
        iVar3 = 0x7c;
      }
      lVar7 = 0;
      if (lVar6 != 0) {
        iVar2 = curl_easy_setopt(lVar6,0x2712,URL);
        uVar1 = _stderr;
        iVar3 = 0;
        if (iVar2 != 0) {
          uVar4 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                        ,0x2a,iVar2,uVar4);
          iVar3 = iVar2;
        }
        if (iVar3 == 0) {
          iVar2 = curl_multi_add_handle(lVar5,lVar6);
          uVar1 = _stderr;
          iVar3 = 0;
          if (iVar2 != 0) {
            uVar4 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                          ,0x2b,iVar2,uVar4);
            iVar3 = iVar2;
          }
          if (iVar3 == 0) {
            lVar7 = curl_easy_init();
            if (lVar7 == 0) {
              curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                            ,0x2d);
              iVar3 = 0x7c;
            }
            else {
              iVar2 = curl_easy_setopt(lVar7,0x2712,URL);
              uVar1 = _stderr;
              iVar3 = 0;
              if (iVar2 != 0) {
                uVar4 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                              ,0x2e,iVar2,uVar4);
                iVar3 = iVar2;
              }
              if (iVar3 == 0) {
                iVar3 = curl_multi_add_handle(lVar5,lVar7);
                uVar1 = _stderr;
                if (iVar3 == 0) {
                  iVar3 = 0;
                }
                else {
                  uVar4 = curl_multi_strerror(iVar3);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                ,0x2f,iVar3,uVar4);
                }
                if (iVar3 == 0) {
                  iVar3 = curl_multi_perform(lVar5,(long)&uStack_38 + 4);
                  uVar1 = _stderr;
                  if (iVar3 == 0) {
                    iVar3 = 0;
                    if ((long)uStack_38 < 0) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                    ,0x31);
                      iVar3 = 0x7a;
                    }
                  }
                  else {
                    uVar4 = curl_multi_strerror(iVar3);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                  ,0x31,iVar3,uVar4);
                  }
                  if (iVar3 == 0) {
                    iVar3 = curl_multi_remove_handle(lVar5,lVar7);
                    uVar1 = _stderr;
                    if (iVar3 == 0) {
                      iVar3 = 0;
                    }
                    else {
                      uVar4 = curl_multi_strerror(iVar3);
                      curl_mfprintf(uVar1,
                                    "%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                    ,0x33,iVar3,uVar4);
                    }
                    if (iVar3 == 0) {
                      iVar3 = curl_multi_remove_handle(lVar5,lVar6);
                      uVar1 = _stderr;
                      if (iVar3 == 0) {
                        iVar3 = 0;
                      }
                      else {
                        uVar4 = curl_multi_strerror(iVar3);
                        curl_mfprintf(uVar1,
                                      "%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                      ,0x36,iVar3,uVar4);
                      }
                    }
                  }
                }
              }
            }
            goto LAB_0010237a;
          }
        }
        lVar7 = 0;
      }
      goto LAB_0010237a;
    }
  }
  iVar3 = iVar2;
  lVar7 = 0;
  lVar6 = 0;
LAB_0010237a:
  curl_easy_cleanup(lVar6);
  curl_easy_cleanup(lVar7);
  curl_multi_cleanup(lVar5);
  curl_global_cleanup();
  return iVar3;
}

Assistant:

int test(char *URL)
{
  CURLM *curlm = NULL;
  CURL *curl1 = NULL;
  CURL *curl2 = NULL;
  int running_handles = 0;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  multi_init(curlm);
  multi_setopt(curlm, CURLMOPT_MAX_HOST_CONNECTIONS, 1);

  easy_init(curl1);
  easy_setopt(curl1, CURLOPT_URL, URL);
  multi_add_handle(curlm, curl1);

  easy_init(curl2);
  easy_setopt(curl2, CURLOPT_URL, URL);
  multi_add_handle(curlm, curl2);

  multi_perform(curlm, &running_handles);

  multi_remove_handle(curlm, curl2);

  /* If curl2 is still in the connect-pending list, this will crash */
  multi_remove_handle(curlm, curl1);

test_cleanup:
  curl_easy_cleanup(curl1);
  curl_easy_cleanup(curl2);
  curl_multi_cleanup(curlm);
  curl_global_cleanup();
  return res;
}